

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O2

void __thiscall
asmjit::ZoneTree<asmjit::AddressTableEntry>::insert<asmjit::Support::Compare<0u>>
          (ZoneTree<asmjit::AddressTableEntry> *this,AddressTableEntry *node,Compare<0U> *cmp)

{
  byte *pbVar1;
  ulong *puVar2;
  ulong uVar3;
  ZoneTreeNode *pZVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  AddressTableEntry *pAVar8;
  AddressTableEntry *pAVar9;
  AddressTableEntry *pAVar10;
  AddressTableEntry *pAVar11;
  AddressTableEntry *root;
  bool bVar12;
  uintptr_t local_40;
  AddressTableEntry *local_38;
  
  uVar3 = (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0];
  if (1 < uVar3) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/../core/zonetree.h"
               ,0xaa,"!node->hasLeft()");
  }
  if ((node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[1] == 0)
  {
    if (uVar3 == 0) {
      pAVar11 = this->_root;
      if (pAVar11 == (AddressTableEntry *)0x0) {
        this->_root = node;
      }
      else {
        pAVar9 = (AddressTableEntry *)&local_40;
        local_40 = 0;
        local_38 = pAVar11;
        (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0] = 1
        ;
        uVar3 = 0;
        uVar5 = 0;
        pAVar10 = (AddressTableEntry *)0x0;
        root = (AddressTableEntry *)0x0;
        while( true ) {
          pAVar8 = pAVar10;
          if (pAVar11 == (AddressTableEntry *)0x0) {
            (pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData
            [uVar5] = (ulong)((uint)(pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                    super_ZoneTreeNode._rbNodeData[uVar5] & 1) | (ulong)node;
            pAVar10 = node;
          }
          else {
            uVar6 = (pAVar11->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                    _rbNodeData[0];
            pbVar7 = (byte *)(uVar6 & 0xfffffffffffffffe);
            pAVar10 = pAVar11;
            if ((((pbVar7 != (byte *)0x0) && ((*pbVar7 & 1) != 0)) &&
                (pbVar1 = (byte *)(pAVar11->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                  super_ZoneTreeNode._rbNodeData[1], pbVar1 != (byte *)0x0)) &&
               ((*pbVar1 & 1) != 0)) {
              (pAVar11->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[0] = uVar6 | 1;
              *pbVar7 = *pbVar7 & 0xfe;
              puVar2 = (ulong *)(pAVar11->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                super_ZoneTreeNode._rbNodeData[1];
              *puVar2 = *puVar2 & 0xfffffffffffffffe;
            }
          }
          if (((pAVar8 != (AddressTableEntry *)0x0) &&
              (((pAVar10->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                _rbNodeData[0] & 1) != 0)) &&
             (((pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
               _rbNodeData[0] & 1) != 0)) {
            bVar12 = root == (AddressTableEntry *)
                             (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                             super_ZoneTreeNode._rbNodeData[1];
            if (pAVar10 ==
                (AddressTableEntry *)
                ((pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[uVar3] & 0xfffffffffffffffe)) {
              pZVar4 = _singleRotate((ZoneTreeNode *)root,(ulong)(uVar3 == 0));
            }
            else {
              pZVar4 = _doubleRotate((ZoneTreeNode *)root,(ulong)(uVar3 == 0));
            }
            (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData
            [bVar12] = (ulong)((uint)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                     super_ZoneTreeNode._rbNodeData[bVar12] & 1) | (ulong)pZVar4;
          }
          if (pAVar10 == node) break;
          uVar6 = (ulong)(pAVar10->_address < node->_address);
          if (root != (AddressTableEntry *)0x0) {
            pAVar9 = root;
          }
          pAVar11 = (AddressTableEntry *)
                    ((pAVar10->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                     _rbNodeData[uVar6] & 0xfffffffffffffffe);
          uVar3 = uVar5;
          uVar5 = uVar6;
          root = pAVar8;
        }
        this->_root = local_38;
        *(byte *)(local_38->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData =
             (byte)(local_38->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                   _rbNodeData[0] & 0xfe;
      }
      return;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/../core/zonetree.h"
               ,0xac,"!node->isRed()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/../core/zonetree.h"
             ,0xab,"!node->hasRight()");
}

Assistant:

inline bool hasLeft() const noexcept { return _rbNodeData[0] > kRedMask; }